

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O0

Dch_Cla_t * Dch_ClassesStart(Aig_Man_t *pAig)

{
  int iVar1;
  Dch_Cla_t *__s;
  Aig_Obj_t ***pppAVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  Dch_Cla_t *p;
  Aig_Man_t *pAig_local;
  
  __s = (Dch_Cla_t *)malloc(0x68);
  memset(__s,0,0x68);
  __s->pAig = pAig;
  iVar1 = Aig_ManObjNumMax(pAig);
  pppAVar2 = (Aig_Obj_t ***)calloc((long)iVar1,8);
  __s->pId2Class = pppAVar2;
  iVar1 = Aig_ManObjNumMax(pAig);
  piVar3 = (int *)calloc((long)iVar1,4);
  __s->pClassSizes = piVar3;
  pVVar4 = Vec_PtrAlloc(100);
  __s->vClassOld = pVVar4;
  pVVar4 = Vec_PtrAlloc(100);
  __s->vClassNew = pVVar4;
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    iVar1 = Aig_ManObjNumMax(pAig);
    Aig_ManReprStart(pAig,iVar1);
    return __s;
  }
  __assert_fail("pAig->pReprs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                ,0x93,"Dch_Cla_t *Dch_ClassesStart(Aig_Man_t *)");
}

Assistant:

Dch_Cla_t * Dch_ClassesStart( Aig_Man_t * pAig )
{
    Dch_Cla_t * p;
    p = ABC_ALLOC( Dch_Cla_t, 1 );
    memset( p, 0, sizeof(Dch_Cla_t) );
    p->pAig         = pAig;
    p->pId2Class    = ABC_CALLOC( Aig_Obj_t **, Aig_ManObjNumMax(pAig) );
    p->pClassSizes  = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->vClassOld    = Vec_PtrAlloc( 100 );
    p->vClassNew    = Vec_PtrAlloc( 100 );
    assert( pAig->pReprs == NULL );
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    return p;
}